

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Gogoing_util.cpp
# Opt level: O3

string * going_make_url(string *__return_storage_ptr__,string *url)

{
  int iVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  long *plVar2;
  size_type *psVar3;
  _Alloc_hider _Var4;
  string url2;
  __string_type __str;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_48;
  ulong local_40;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_38;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  local_68._M_string_length = 0;
  local_68.field_2._M_local_buf[0] = '\0';
  local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
  iVar1 = std::__cxx11::string::find((char *)url,(ulong)going_domain_abi_cxx11_._M_dataplus._M_p,0);
  if (iVar1 == -1) {
    std::__cxx11::string::_M_assign((string *)&local_68);
  }
  else {
    std::__cxx11::string::substr((ulong)&local_88,(ulong)url);
    std::__cxx11::string::operator=((string *)&local_68,(string *)&local_88);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_dataplus._M_p != &local_88.field_2) {
      operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
    }
  }
  if (going_docroot_abi_cxx11_._M_dataplus._M_p[going_docroot_abi_cxx11_._M_string_length - 1] ==
      '/') {
    if (*local_68._M_dataplus._M_p == '/') {
      __rhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              std::__cxx11::string::erase((ulong)&local_68,0);
      std::operator+(&local_88,&going_docroot_abi_cxx11_,__rhs);
    }
    else {
      std::operator+(&local_88,&going_docroot_abi_cxx11_,&local_68);
    }
LAB_001062d6:
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_88);
    local_38._M_allocated_capacity = local_88.field_2._M_allocated_capacity;
    _Var4._M_p = local_88._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_dataplus._M_p == &local_88.field_2) goto LAB_001063c4;
  }
  else {
    if (*local_68._M_dataplus._M_p == '/') {
      std::operator+(&local_88,&going_docroot_abi_cxx11_,&local_68);
      goto LAB_001062d6;
    }
    local_48 = &local_38;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_48,going_docroot_abi_cxx11_._M_dataplus._M_p,
               going_docroot_abi_cxx11_._M_dataplus._M_p + going_docroot_abi_cxx11_._M_string_length
              );
    std::__cxx11::string::_M_replace_aux((ulong)&local_48,local_40,0,'\x01');
    plVar2 = (long *)std::__cxx11::string::_M_append
                               ((char *)&local_48,(ulong)local_68._M_dataplus._M_p);
    psVar3 = (size_type *)(plVar2 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar2 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar3) {
      local_88.field_2._M_allocated_capacity = *psVar3;
      local_88.field_2._8_8_ = plVar2[3];
      local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
    }
    else {
      local_88.field_2._M_allocated_capacity = *psVar3;
      local_88._M_dataplus._M_p = (pointer)*plVar2;
    }
    local_88._M_string_length = plVar2[1];
    *plVar2 = (long)psVar3;
    plVar2[1] = 0;
    *(undefined1 *)(plVar2 + 2) = 0;
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_88);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_dataplus._M_p != &local_88.field_2) {
      operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
    }
    _Var4._M_p = (pointer)local_48;
    if (local_48 == &local_38) goto LAB_001063c4;
  }
  operator_delete(_Var4._M_p,local_38._M_allocated_capacity + 1);
LAB_001063c4:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p,
                    CONCAT71(local_68.field_2._M_allocated_capacity._1_7_,
                             local_68.field_2._M_local_buf[0]) + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

string going_make_url(const string& url)
{
	string real_url, url2;

	int n = 0;

	if((n = url.find(going_domain, 0)) != string::npos)//url中包含域名，要将其删去
		url2 = url.substr(going_domain.size(), url.size() - going_domain.size());
	else
		url2 = url;

	if(going_docroot[going_docroot.size() - 1] == '/')//配置项docroot末尾有'/'
	{
		if(url2[0] == '/')
			real_url = going_docroot + url2.erase(0, 1);
		else
			real_url = going_docroot + url2;
	}else{//配置项末尾没有'/'
		if(url2[0] == '/')
			real_url = going_docroot + url2;
		else
			real_url = going_docroot + '/' + url2;
	}

	return real_url;
}